

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_writer.cpp
# Opt level: O3

void __thiscall
embree::XMLWriter::store(XMLWriter *this,Ref<embree::SceneGraph::LightNode> *node,ssize_t id)

{
  LightNode *pLVar1;
  long *plVar2;
  runtime_error *this_00;
  ssize_t id_00;
  
  pLVar1 = node->ptr;
  if (pLVar1 != (LightNode *)0x0) {
    plVar2 = (long *)__dynamic_cast(pLVar1,&SceneGraph::LightNode::typeinfo,
                                    &SceneGraph::LightNodeImpl<embree::SceneGraph::AmbientLight>::
                                     typeinfo,0);
    if (plVar2 == (long *)0x0) {
      plVar2 = (long *)__dynamic_cast(pLVar1,&SceneGraph::LightNode::typeinfo,
                                      &SceneGraph::LightNodeImpl<embree::SceneGraph::PointLight>::
                                       typeinfo,0);
      if (plVar2 == (long *)0x0) {
        plVar2 = (long *)__dynamic_cast(pLVar1,&SceneGraph::LightNode::typeinfo,
                                        &SceneGraph::
                                         LightNodeImpl<embree::SceneGraph::DirectionalLight>::
                                         typeinfo,0);
        if (plVar2 == (long *)0x0) {
          plVar2 = (long *)__dynamic_cast(pLVar1,&SceneGraph::LightNode::typeinfo,
                                          &SceneGraph::LightNodeImpl<embree::SceneGraph::SpotLight>
                                           ::typeinfo,0);
          if (plVar2 == (long *)0x0) {
            plVar2 = (long *)__dynamic_cast(pLVar1,&SceneGraph::LightNode::typeinfo,
                                            &SceneGraph::
                                             LightNodeImpl<embree::SceneGraph::DistantLight>::
                                             typeinfo,0);
            if (plVar2 == (long *)0x0) {
              plVar2 = (long *)__dynamic_cast(pLVar1,&SceneGraph::LightNode::typeinfo,
                                              &SceneGraph::
                                               LightNodeImpl<embree::SceneGraph::TriangleLight>::
                                               typeinfo,0);
              if (plVar2 == (long *)0x0) {
                plVar2 = (long *)__dynamic_cast(pLVar1,&SceneGraph::LightNode::typeinfo,
                                                &SceneGraph::
                                                 LightNodeImpl<embree::SceneGraph::QuadLight>::
                                                 typeinfo,0);
                if (plVar2 == (long *)0x0) goto LAB_00198782;
                (**(code **)(*plVar2 + 0x10))(plVar2);
                store(this,(QuadLight *)(plVar2 + 0xe),id);
                (**(code **)(*plVar2 + 0x18))(plVar2);
              }
              else {
                (**(code **)(*plVar2 + 0x10))(plVar2);
                store(this,(TriangleLight *)(plVar2 + 0xe),id);
                (**(code **)(*plVar2 + 0x18))(plVar2);
              }
            }
            else {
              (**(code **)(*plVar2 + 0x10))(plVar2);
              store(this,(DistantLight *)(plVar2 + 0xe),id);
              (**(code **)(*plVar2 + 0x18))(plVar2);
            }
          }
          else {
            (**(code **)(*plVar2 + 0x10))(plVar2);
            store(this,(SpotLight *)(plVar2 + 0xe),id);
            (**(code **)(*plVar2 + 0x18))(plVar2);
          }
        }
        else {
          (**(code **)(*plVar2 + 0x10))(plVar2);
          store(this,(DirectionalLight *)(plVar2 + 0xe),id);
          (**(code **)(*plVar2 + 0x18))(plVar2);
        }
      }
      else {
        (**(code **)(*plVar2 + 0x10))(plVar2);
        store(this,(PointLight *)(plVar2 + 0xe),id);
        (**(code **)(*plVar2 + 0x18))(plVar2);
      }
    }
    else {
      (**(code **)(*plVar2 + 0x10))(plVar2);
      store(this,(AmbientLight *)(plVar2 + 0xe),id_00);
      (**(code **)(*plVar2 + 0x18))(plVar2);
    }
    return;
  }
LAB_00198782:
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"unsupported light");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void XMLWriter::open(std::string str)
  {
    tab(); xml << "<" << str << ">" << std::endl;
    ident+=2;
  }